

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O0

bool libaom_examples::anon_unknown_0::parse_multilayer_layer_alpha
               (ifstream *file,int min_indent,int *line_idx,AlphaInformation *alpha_info)

{
  bool bVar1;
  uint uVar2;
  pair<libaom_examples::ColorProperties,_bool> pVar3;
  undefined3 extraout_var;
  undefined8 uVar4;
  int *in_RCX;
  uint *in_RDX;
  int alpha_max;
  bool *in_stack_00000060;
  ColorProperties color;
  int *in_stack_00000068;
  bool in_stack_00000073;
  int in_stack_00000074;
  ifstream *in_stack_00000078;
  bool syntax_error;
  ParsedValue value;
  string field_name;
  int indent;
  bool has_list_prefix;
  AlphaInformation *in_stack_ffffffffffffff08;
  string *__rhs;
  AlphaInformation *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ColorProperties *v;
  int in_stack_ffffffffffffff24;
  int64_t in_stack_ffffffffffffff28;
  FILE *__stream;
  int64_t in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  pair<libaom_examples::ColorProperties,_bool> local_99;
  undefined4 local_90;
  undefined4 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined2 uVar10;
  undefined2 uVar11;
  undefined4 in_stack_ffffffffffffff8c;
  uint in_stack_ffffffffffffff94;
  ifstream *in_stack_ffffffffffffff98;
  string local_50 [32];
  undefined4 local_30;
  int *local_28;
  uint *local_20;
  byte local_1;
  
  local_30 = 0xffffffff;
  local_28 = in_RCX;
  local_20 = in_RDX;
  std::__cxx11::string::string(local_50);
  ParsedValue::ParsedValue((ParsedValue *)&stack0xffffffffffffff98);
  uVar5 = 0;
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  uVar9 = 0;
  uVar10 = 0;
  uVar11 = 0;
  std::pair<libaom_examples::ColorProperties,_bool>::
  pair<libaom_examples::ColorProperties,_bool,_true>
            ((pair<libaom_examples::ColorProperties,_bool> *)in_stack_ffffffffffffff10);
  AlphaInformation::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  do {
    while( true ) {
      v = (ColorProperties *)&stack0xffffffffffffff97;
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &stack0xffffffffffffff98;
      __rhs = local_50;
      bVar1 = parse_line(in_stack_00000078,in_stack_00000074,in_stack_00000073,in_stack_00000068,
                         in_stack_00000060,_alpha_max,(string *)value._0_8_,
                         (ParsedValue *)value.int_value_,(bool *)value.double_value_);
      if (!bVar1) {
        if ((in_stack_ffffffffffffff94 & 0x1000000) == 0) {
          if (*(char *)((long)local_28 + 5) == '\0') {
            fprintf(_stderr,
                    "Error: alpha_bit_depth must be specified (in range [8, 15]) for alpha info\n");
            local_1 = 0;
          }
          else {
            uVar2 = (1 << (*(char *)((long)local_28 + 5) + 1U & 0x1f)) - 1;
            if ((int)uVar2 < (int)(uint)*(ushort *)(local_28 + 2)) {
              fprintf(_stderr,"Error: alpha_transparent_value %d out of range [0, %d]\n",
                      (ulong)*(ushort *)(local_28 + 2),(ulong)uVar2);
              local_1 = 0;
            }
            else if ((int)uVar2 < (int)(uint)*(ushort *)((long)local_28 + 10)) {
              fprintf(_stderr,"Error: alpha_opaque_value %d out of range [0, %d]\n",
                      (ulong)*(ushort *)((long)local_28 + 10),(ulong)uVar2);
              local_1 = 0;
            }
            else if (((*(byte *)(local_28 + 4) & 1) == 0) || (*local_28 == 0)) {
              local_1 = 1;
            }
            else {
              fprintf(_stderr,
                      "Error: alpha_color_description can only be set if alpha_use_idc is %d\n",0);
              local_1 = 0;
            }
          }
        }
        else {
          local_1 = 0;
        }
        goto LAB_0012fd85;
      }
      bVar1 = std::operator==(__lhs,(char *)__rhs);
      if (bVar1) break;
      bVar1 = std::operator==(__lhs,(char *)__rhs);
      if (bVar1) {
        bVar1 = ParsedValue::IntegerValueInRange<bool>
                          ((ParsedValue *)
                           CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                           in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                           in_stack_ffffffffffffff24,&v->color_range);
        if (!bVar1) {
          local_1 = 0;
          goto LAB_0012fd85;
        }
      }
      else {
        bVar1 = std::operator==(__lhs,(char *)__rhs);
        if (bVar1) {
          bVar1 = ParsedValue::IntegerValueInRange<unsigned_char>
                            ((ParsedValue *)
                             CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                             in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                             in_stack_ffffffffffffff24,&v->color_range);
          if (!bVar1) {
            local_1 = 0;
            goto LAB_0012fd85;
          }
        }
        else {
          bVar1 = std::operator==(__lhs,(char *)__rhs);
          if (bVar1) {
            bVar1 = ParsedValue::IntegerValueInRange<unsigned_char>
                              ((ParsedValue *)
                               CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                               in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                               in_stack_ffffffffffffff24,&v->color_range);
            if (!bVar1) {
              local_1 = 0;
              goto LAB_0012fd85;
            }
          }
          else {
            bVar1 = std::operator==(__lhs,(char *)__rhs);
            if (bVar1) {
              bVar1 = ParsedValue::IntegerValueInRange<bool>
                                ((ParsedValue *)
                                 CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                                 in_stack_ffffffffffffff24,&v->color_range);
              if (!bVar1) {
                local_1 = 0;
                goto LAB_0012fd85;
              }
            }
            else {
              bVar1 = std::operator==(__lhs,(char *)__rhs);
              if (bVar1) {
                std::numeric_limits<unsigned_short>::min();
                std::numeric_limits<unsigned_short>::max();
                bVar1 = ParsedValue::IntegerValueInRange<unsigned_short>
                                  ((ParsedValue *)
                                   CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                                   in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                                   in_stack_ffffffffffffff24,(unsigned_short *)v);
                if (!bVar1) {
                  local_1 = 0;
                  goto LAB_0012fd85;
                }
              }
              else {
                bVar1 = std::operator==(__lhs,(char *)__rhs);
                if (bVar1) {
                  std::numeric_limits<unsigned_short>::min();
                  std::numeric_limits<unsigned_short>::max();
                  bVar1 = ParsedValue::IntegerValueInRange<unsigned_short>
                                    ((ParsedValue *)
                                     CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                                     in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                                     in_stack_ffffffffffffff24,(unsigned_short *)v);
                  if (!bVar1) {
                    local_1 = 0;
                    goto LAB_0012fd85;
                  }
                }
                else {
                  bVar1 = std::operator==(__lhs,(char *)__rhs);
                  if (!bVar1) {
                    __stream = _stderr;
                    uVar4 = std::__cxx11::string::c_str();
                    fprintf(__stream,"Error: Unknown field \'%s\' at line %d\n",uVar4,
                            (ulong)*local_20);
                    local_1 = 0;
                    goto LAB_0012fd85;
                  }
                  in_stack_ffffffffffffff3f =
                       parse_color_properties
                                 (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                                  (int *)CONCAT44(in_stack_ffffffffffffff8c,CONCAT22(uVar11,uVar10))
                                  ,(ColorProperties *)
                                   CONCAT17(uVar9,CONCAT16(uVar8,CONCAT15(uVar7,CONCAT14(uVar6,uVar5
                                                                                        )))));
                  if (!(bool)in_stack_ffffffffffffff3f) {
                    local_1 = 0;
                    goto LAB_0012fd85;
                  }
                  pVar3 = value_present<libaom_examples::ColorProperties>(v);
                  in_stack_ffffffffffffff30 = CONCAT35(extraout_var,pVar3);
                  local_99.first = pVar3.first;
                  local_99.second = pVar3.second;
                  std::pair<libaom_examples::ColorProperties,_bool>::operator=
                            ((pair<libaom_examples::ColorProperties,_bool> *)(local_28 + 3),
                             &local_99);
                }
              }
            }
          }
        }
      }
    }
    bVar1 = ParsedValue::IntegerValueInRange<libaom_examples::AlphaUse>
                      ((ParsedValue *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                       in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24
                       ,(AlphaUse *)v);
  } while (bVar1);
  local_1 = 0;
LAB_0012fd85:
  local_90 = 1;
  std::__cxx11::string::~string(local_50);
  return (bool)(local_1 & 1);
}

Assistant:

bool parse_multilayer_layer_alpha(std::ifstream &file, int min_indent,
                                  int *line_idx, AlphaInformation *alpha_info) {
  bool has_list_prefix;
  int indent = -1;
  std::string field_name;
  ParsedValue value;
  bool syntax_error;
  *alpha_info = {};
  while (parse_line(file, min_indent, /*is_list=*/false, &indent,
                    &has_list_prefix, line_idx, &field_name, &value,
                    &syntax_error)) {
    if (field_name == "alpha_use_idc") {
      RETURN_IF_FALSE(value.IntegerValueInRange(
          /*min=*/0, /*max=*/7, *line_idx, &alpha_info->alpha_use_idc));
    } else if (field_name == "alpha_simple_flag") {
      RETURN_IF_FALSE(value.IntegerValueInRange(
          /*min=*/0, /*max=*/1, *line_idx, &alpha_info->alpha_simple_flag));
    } else if (field_name == "alpha_bit_depth") {
      RETURN_IF_FALSE(value.IntegerValueInRange(
          /*min=*/8, /*max=*/15, *line_idx, &alpha_info->alpha_bit_depth));
    } else if (field_name == "alpha_clip_idc") {
      RETURN_IF_FALSE(value.IntegerValueInRange(/*min=*/0, /*max=*/3, *line_idx,
                                                &alpha_info->alpha_clip_idc));
    } else if (field_name == "alpha_incr_flag") {
      RETURN_IF_FALSE(value.IntegerValueInRange(/*min=*/0, /*max=*/1, *line_idx,
                                                &alpha_info->alpha_incr_flag));
    } else if (field_name == "alpha_transparent_value") {
      // At this point we may not have parsed 'alpha_bit_depth' yet, so the
      // exact range is checked later.
      RETURN_IF_FALSE(value.IntegerValueInRange(
          std::numeric_limits<uint16_t>::min(),
          std::numeric_limits<uint16_t>::max(), *line_idx,
          &alpha_info->alpha_transparent_value));
    } else if (field_name == "alpha_opaque_value") {
      // At this point we may not have parsed 'alpha_bit_depth' yet, so the
      // exact range is checked later.
      RETURN_IF_FALSE(value.IntegerValueInRange(
          std::numeric_limits<uint16_t>::min(),
          std::numeric_limits<uint16_t>::max(), *line_idx,
          &alpha_info->alpha_opaque_value));
    } else if (field_name == "alpha_color_description") {
      ColorProperties color;
      RETURN_IF_FALSE(parse_color_properties(file, indent, line_idx, &color));
      alpha_info->alpha_color_description = value_present(color);
    } else {
      fprintf(stderr, "Error: Unknown field '%s' at line %d\n",
              field_name.c_str(), *line_idx);
      return false;
    }
  }
  if (syntax_error) return false;

  // Validation.
  if (alpha_info->alpha_bit_depth == 0) {
    fprintf(stderr,
            "Error: alpha_bit_depth must be specified (in range [8, 15]) for "
            "alpha info\n");
    return false;
  }
  const int alpha_max = (1 << (alpha_info->alpha_bit_depth + 1)) - 1;
  if (alpha_info->alpha_transparent_value > alpha_max) {
    fprintf(stderr, "Error: alpha_transparent_value %d out of range [0, %d]\n",
            alpha_info->alpha_transparent_value, alpha_max);
    return false;
  }
  if (alpha_info->alpha_opaque_value > alpha_max) {
    fprintf(stderr, "Error: alpha_opaque_value %d out of range [0, %d]\n",
            alpha_info->alpha_opaque_value, alpha_max);
    return false;
  }
  if (alpha_info->alpha_color_description.second &&
      (alpha_info->alpha_use_idc != ALPHA_STRAIGHT)) {
    fprintf(stderr,
            "Error: alpha_color_description can only be set if alpha_use_idc "
            "is %d\n",
            ALPHA_STRAIGHT);
    return false;
  }
  return true;
}